

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::identDot(GrpParser *this)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  RefToken *t;
  undefined8 uVar5;
  long *in_RDI;
  ParserException *ex;
  RefAST tmp19_AST;
  RefAST tmp18_AST;
  RefAST tmp17_AST;
  RefAST tmp16_AST;
  RefAST tmp15_AST;
  RefAST tmp14_AST;
  RefAST identDot_AST;
  ASTPair currentAST;
  ASTPair *in_stack_fffffffffffffe00;
  BitSet *in_stack_fffffffffffffe08;
  ASTPair *in_stack_fffffffffffffe10;
  RefCount<AST> *in_stack_fffffffffffffe18;
  RefCount<AST> *in_stack_fffffffffffffe20;
  RefAST *in_stack_fffffffffffffe30;
  ASTFactory *in_stack_fffffffffffffe38;
  ASTFactory *this_00;
  int iVar6;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  RefToken *in_stack_fffffffffffffe78;
  NoViableAltException *in_stack_fffffffffffffe80;
  undefined1 local_120 [15];
  undefined1 local_111;
  undefined1 local_110 [16];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [40];
  undefined1 local_98 [31];
  undefined1 local_79;
  undefined1 local_78 [16];
  undefined1 local_68 [32];
  undefined1 local_48 [56];
  GrpParser *in_stack_fffffffffffffff0;
  
  RefCount<AST>::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  ASTPair::ASTPair(in_stack_fffffffffffffe10);
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffe10->root,(RefCount<AST> *)in_stack_fffffffffffffe08);
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if ((((iVar2 == 0xd) || (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1), iVar2 == 0x39)) &&
      (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 == 0x12)) &&
     (((iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,3), iVar2 == 0xd ||
       (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,3), iVar2 == 0x17)) ||
      (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,3), iVar2 == 0x39)))) {
    iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    if (iVar2 == 0xd) {
      RefCount<AST>::RefCount
                (&in_stack_fffffffffffffe10->root,(RefCount<AST> *)in_stack_fffffffffffffe08);
      (**(code **)(*in_RDI + 0x28))(local_48,in_RDI,1);
      ASTFactory::create(in_stack_fffffffffffffe38,(RefToken *)in_stack_fffffffffffffe30);
      RefCount<AST>::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
      RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe10);
      RefCount<AST>::RefCount
                (&in_stack_fffffffffffffe10->root,(RefCount<AST> *)in_stack_fffffffffffffe08);
      ASTFactory::addASTChild
                ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (ASTPair *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 (RefAST *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
      Parser::match((Parser *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                    (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
    }
    else {
      if (iVar2 != 0x39) {
        local_79 = 1;
        t = (RefToken *)__cxa_allocate_exception(0x40);
        (**(code **)(*in_RDI + 0x28))(local_78,in_RDI,1);
        NoViableAltException::NoViableAltException(in_stack_fffffffffffffe80,t);
        local_79 = 0;
        __cxa_throw(t,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
      }
      RefCount<AST>::RefCount
                (&in_stack_fffffffffffffe10->root,(RefCount<AST> *)in_stack_fffffffffffffe08);
      (**(code **)(*in_RDI + 0x28))(local_68,in_RDI,1);
      ASTFactory::create(in_stack_fffffffffffffe38,(RefToken *)in_stack_fffffffffffffe30);
      RefCount<AST>::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
      RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe10);
      RefCount<AST>::RefCount
                (&in_stack_fffffffffffffe10->root,(RefCount<AST> *)in_stack_fffffffffffffe08);
      ASTFactory::addASTChild
                ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (ASTPair *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 (RefAST *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
      Parser::match((Parser *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                    (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
    }
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe10->root,(RefCount<AST> *)in_stack_fffffffffffffe08);
    (**(code **)(*in_RDI + 0x28))(local_98,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffe38,(RefToken *)in_stack_fffffffffffffe30);
    RefCount<AST>::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe10);
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe10->root,(RefCount<AST> *)in_stack_fffffffffffffe08);
    ASTFactory::makeASTRoot
              ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (ASTPair *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    iVar2 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
    Parser::match((Parser *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),iVar2);
    identDot(in_stack_fffffffffffffff0);
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe10->root,(RefCount<AST> *)in_stack_fffffffffffffe08);
    ASTFactory::addASTChild
              ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (ASTPair *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
               (RefAST *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
LAB_001f1ffb:
    RefCount<AST>::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    RefCount<AST>::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
    ASTPair::~ASTPair(in_stack_fffffffffffffe00);
    return;
  }
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (((iVar2 == 0xd) || (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1), iVar2 == 0x17)) ||
     (in_stack_fffffffffffffe54 = (**(code **)(*in_RDI + 0x20))(in_RDI,1),
     in_stack_fffffffffffffe54 == 0x39)) {
    uVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,2);
    bVar1 = BitSet::member(in_stack_fffffffffffffe08,(int)((ulong)in_stack_fffffffffffffe00 >> 0x20)
                          );
    uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe4c);
    if (bVar1) {
      uVar4 = (**(code **)(*in_RDI + 0x20))(in_RDI,3);
      bVar1 = BitSet::member(in_stack_fffffffffffffe08,
                             (int)((ulong)in_stack_fffffffffffffe00 >> 0x20));
      uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe44);
      if (bVar1) {
        iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
        if (iVar2 == 0xd) {
          RefCount<AST>::RefCount
                    (&in_stack_fffffffffffffe10->root,(RefCount<AST> *)in_stack_fffffffffffffe08);
          this_00 = (ASTFactory *)(in_RDI + 6);
          (**(code **)(*in_RDI + 0x28))(local_c0,in_RDI,1);
          ASTFactory::create(this_00,(RefToken *)in_stack_fffffffffffffe30);
          iVar6 = (int)((ulong)this_00 >> 0x20);
          RefCount<AST>::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
          RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe10);
          RefCount<AST>::RefCount
                    (&in_stack_fffffffffffffe10->root,(RefCount<AST> *)in_stack_fffffffffffffe08);
          ASTFactory::addASTChild
                    ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe54,uVar3),
                     (ASTPair *)CONCAT44(uVar8,uVar4),(RefAST *)CONCAT44(uVar7,iVar2));
          RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
          Parser::match((Parser *)CONCAT44(uVar7,iVar2),iVar6);
          RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
        }
        else if (iVar2 == 0x17) {
          RefCount<AST>::RefCount
                    (&in_stack_fffffffffffffe10->root,(RefCount<AST> *)in_stack_fffffffffffffe08);
          in_stack_fffffffffffffe18 = (RefCount<AST> *)(in_RDI + 6);
          (**(code **)(*in_RDI + 0x28))(local_100,in_RDI,1);
          ASTFactory::create(in_stack_fffffffffffffe38,(RefToken *)in_stack_fffffffffffffe30);
          iVar6 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
          RefCount<AST>::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
          RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe10);
          RefCount<AST>::RefCount
                    ((RefCount<AST> *)(in_RDI + 6),(RefCount<AST> *)in_stack_fffffffffffffe08);
          ASTFactory::addASTChild
                    ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe54,uVar3),
                     (ASTPair *)CONCAT44(uVar8,uVar4),(RefAST *)CONCAT44(uVar7,iVar2));
          RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
          Parser::match((Parser *)CONCAT44(uVar7,iVar2),iVar6);
          RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
        }
        else {
          if (iVar2 != 0x39) {
            local_111 = 1;
            uVar5 = __cxa_allocate_exception(0x40);
            (**(code **)(*in_RDI + 0x28))(local_110,in_RDI,1);
            NoViableAltException::NoViableAltException
                      (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
            local_111 = 0;
            __cxa_throw(uVar5,&NoViableAltException::typeinfo,
                        NoViableAltException::~NoViableAltException);
          }
          RefCount<AST>::RefCount
                    (&in_stack_fffffffffffffe10->root,(RefCount<AST> *)in_stack_fffffffffffffe08);
          (**(code **)(*in_RDI + 0x28))(local_e0,in_RDI,1);
          ASTFactory::create(in_stack_fffffffffffffe38,(RefToken *)in_stack_fffffffffffffe30);
          iVar6 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
          RefCount<AST>::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
          RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe10);
          in_stack_fffffffffffffe20 = (RefCount<AST> *)(in_RDI + 6);
          RefCount<AST>::RefCount
                    (&in_stack_fffffffffffffe10->root,(RefCount<AST> *)in_stack_fffffffffffffe08);
          ASTFactory::addASTChild
                    ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe54,uVar3),
                     (ASTPair *)CONCAT44(uVar8,uVar4),(RefAST *)CONCAT44(uVar7,iVar2));
          RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
          Parser::match((Parser *)CONCAT44(uVar7,iVar2),iVar6);
          RefCount<AST>::~RefCount(&in_stack_fffffffffffffe00->root);
        }
        goto LAB_001f1ffb;
      }
    }
  }
  uVar5 = __cxa_allocate_exception(0x40);
  (**(code **)(*in_RDI + 0x28))(local_120,in_RDI,1);
  NoViableAltException::NoViableAltException(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  __cxa_throw(uVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::identDot() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST identDot_AST = nullAST;
	
	try {      // for error handling
		{
		if ((LA(1)==IDENT||LA(1)==LITERAL_position) && (LA(2)==OP_DOT) && (LA(3)==IDENT||LA(3)==LITERAL_glyph||LA(3)==LITERAL_position)) {
			{
			switch ( LA(1)) {
			case IDENT:
			{
				RefAST tmp14_AST = nullAST;
				tmp14_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp14_AST);
				match(IDENT);
				break;
			}
			case LITERAL_position:
			{
				RefAST tmp15_AST = nullAST;
				tmp15_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp15_AST);
				match(LITERAL_position);
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			RefAST tmp16_AST = nullAST;
			tmp16_AST = astFactory.create(LT(1));
			astFactory.makeASTRoot(currentAST, tmp16_AST);
			match(OP_DOT);
			identDot();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==IDENT||LA(1)==LITERAL_glyph||LA(1)==LITERAL_position) && (_tokenSet_6.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			{
			switch ( LA(1)) {
			case IDENT:
			{
				RefAST tmp17_AST = nullAST;
				tmp17_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp17_AST);
				match(IDENT);
				break;
			}
			case LITERAL_position:
			{
				RefAST tmp18_AST = nullAST;
				tmp18_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp18_AST);
				match(LITERAL_position);
				break;
			}
			case LITERAL_glyph:
			{
				RefAST tmp19_AST = nullAST;
				tmp19_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp19_AST);
				match(LITERAL_glyph);
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		identDot_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_6);
	}
	returnAST = identDot_AST;
}